

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

QSize __thiscall QToolBoxButton::sizeHint(QToolBoxButton *this)

{
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  undefined8 uVar4;
  int iVar5;
  QSize QVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  QAbstractButton::icon((QAbstractButton *)local_58);
  cVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)local_58);
  iVar5 = 8;
  iVar2 = 8;
  if (cVar1 == '\0') {
    pQVar3 = QWidget::style((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3e,0);
    iVar5 = iVar2 + 10;
    iVar2 = iVar2 + 8;
  }
  QFontMetrics::QFontMetrics
            ((QFontMetrics *)(local_58 + 0x18),
             &((this->super_QAbstractButton).super_QWidget.data)->fnt);
  QAbstractButton::text((QString *)local_58,&this->super_QAbstractButton);
  uVar4 = QFontMetrics::size((int)(QFontMetrics *)(local_58 + 0x18),(QString *)0x800,(int)local_58,
                             (int *)0x0);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  RVar7.m_i = (int)((ulong)uVar4 >> 0x20) + 8;
  QFontMetrics::~QFontMetrics((QFontMetrics *)(local_58 + 0x18));
  if (RVar7.m_i < iVar2) {
    RVar7.m_i = iVar2;
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    QVar6.wd.m_i = iVar5 + (int)uVar4;
    QVar6.ht.m_i = RVar7.m_i;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBoxButton::sizeHint() const
{
    QSize iconSize(8, 8);
    if (!icon().isNull()) {
        int icone = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, parentWidget() /* QToolBox */);
        iconSize += QSize(icone + 2, icone);
    }
    QSize textSize = fontMetrics().size(Qt::TextShowMnemonic, text()) + QSize(0, 8);

    return QSize(iconSize.width() + textSize.width(), qMax(iconSize.height(), textSize.height()));
}